

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::WebSocketImpl> *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  PromiseArenaMember *node;
  long *plVar5;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x380);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x388);
      *(undefined8 *)((long)pointer + 0x380) = 0;
      *(undefined8 *)((long)pointer + 0x388) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x390))
                (*(undefined8 **)((long)pointer + 0x390),lVar1,1,uVar2,uVar2,0);
    }
    lVar1 = *(long *)((long)pointer + 0x360);
    if (lVar1 != 0) {
      lVar3 = *(long *)((long)pointer + 0x368);
      lVar4 = *(long *)((long)pointer + 0x370);
      *(undefined8 *)((long)pointer + 0x360) = 0;
      *(undefined8 *)((long)pointer + 0x368) = 0;
      *(undefined8 *)((long)pointer + 0x370) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x378))
                (*(undefined8 **)((long)pointer + 0x378),lVar1,0x18,
                 (lVar3 - lVar1 >> 3) * -0x5555555555555555,
                 (lVar4 - lVar1 >> 3) * -0x5555555555555555,
                 ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
    }
    if ((*(char *)((long)pointer + 0x348) == '\x01') &&
       (node = *(PromiseArenaMember **)((long)pointer + 0x350), node != (PromiseArenaMember *)0x0))
    {
      *(undefined8 *)((long)pointer + 0x350) = 0;
      PromiseDisposer::dispose(node);
    }
    if (*(char *)((long)pointer + 0x310) == '\x01') {
      plVar5 = *(long **)((long)pointer + 0x340);
      if (plVar5 != (long *)0x0) {
        *(undefined8 *)((long)pointer + 0x340) = 0;
        (**(code **)**(undefined8 **)((long)pointer + 0x338))
                  (*(undefined8 **)((long)pointer + 0x338),(long)plVar5 + *(long *)(*plVar5 + -0x10)
                  );
      }
      lVar1 = *(long *)((long)pointer + 800);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)pointer + 0x328);
        *(undefined8 *)((long)pointer + 800) = 0;
        *(undefined8 *)((long)pointer + 0x328) = 0;
        (**(code **)**(undefined8 **)((long)pointer + 0x330))
                  (*(undefined8 **)((long)pointer + 0x330),lVar1,1,uVar2,uVar2,0);
      }
    }
    if (*(char *)((long)pointer + 0x178) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x180));
    }
    if (*(char *)((long)pointer + 0xe0) == '\x01') {
      if (*(int *)((long)pointer + 0xe8) == 1) {
        inflateEnd((long)pointer + 0xf0);
      }
      else if (*(int *)((long)pointer + 0xe8) == 0) {
        deflateEnd((long)pointer + 0xf0);
      }
    }
    if (*(char *)((long)pointer + 0x60) == '\x01') {
      if (*(int *)((long)pointer + 0x68) == 1) {
        inflateEnd((long)pointer + 0x70);
      }
      else if (*(int *)((long)pointer + 0x68) == 0) {
        deflateEnd((long)pointer + 0x70);
      }
    }
    plVar5 = *(long **)((long)pointer + 0x18);
    if (plVar5 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x10))
                (*(undefined8 **)((long)pointer + 0x10),(long)plVar5 + *(long *)(*plVar5 + -0x10));
    }
  }
  operator_delete(pointer,0x3b8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }